

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::PrepareReferenceData<3u>
          (CompressedSubImageTest *this,GLenum internalformat)

{
  GLint GVar1;
  GLint in_EAX;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLubyte *pGVar5;
  undefined4 *puVar6;
  GLint compressed_texture_size;
  GLint is_compressed_texture;
  long lVar4;
  
  compressed_texture_size = in_EAX;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0xb8))(0x8c1a,this->m_to_aux);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1234);
  TextureImage<3u>(this,internalformat);
  if (this->m_reference == (GLubyte *)0x0) {
    _compressed_texture_size = (ulong)(uint)compressed_texture_size;
    (**(code **)(lVar4 + 0xab0))(0x8c1a,0,0x86a1,&is_compressed_texture);
    if (is_compressed_texture != 0) {
      _compressed_texture_size = (ulong)(uint)is_compressed_texture << 0x20;
      (**(code **)(lVar4 + 0xab0))(0x8c1a,0,0x86a0,&compressed_texture_size);
      GVar1 = compressed_texture_size;
      if ((long)compressed_texture_size != 0) {
        pGVar5 = (GLubyte *)operator_new__((long)compressed_texture_size);
        this->m_reference = pGVar5;
        this->m_reference_size = GVar1;
        (**(code **)(lVar4 + 0x7c8))(0x8c1a,0,pGVar5);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glGetCompressedTexImage has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1259);
      }
    }
    return;
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

void CompressedSubImageTest::PrepareReferenceData(glw::GLenum internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Using OpenGL to compress raw data. */
	gl.bindTexture(TextureTarget<D>(), m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	TextureImage<D>(internalformat);

	/* Sanity checks. */
	if (DE_NULL != m_reference)
	{
		throw 0;
	}

	/* Check that really compressed texture. */
	glw::GLint is_compressed_texture = 0;
	gl.getTexLevelParameteriv(TextureTarget<D>(), 0, GL_TEXTURE_COMPRESSED, &is_compressed_texture);

	if (is_compressed_texture)
	{
		/* Query texture size. */
		glw::GLint compressed_texture_size = 0;
		gl.getTexLevelParameteriv(TextureTarget<D>(), 0, GL_TEXTURE_COMPRESSED_IMAGE_SIZE, &compressed_texture_size);

		/* If compressed then download. */
		if (compressed_texture_size)
		{
			/* Prepare storage. */
			m_reference = new glw::GLubyte[compressed_texture_size];

			if (DE_NULL != m_reference)
			{
				m_reference_size = compressed_texture_size;
			}
			else
			{
				throw 0;
			}

			/* Download compressed texture image. */
			gl.getCompressedTexImage(TextureTarget<D>(), 0, m_reference);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");
		}
	}
}